

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *this)

{
  unsigned___int128 *puVar1;
  char *pcVar2;
  char cVar3;
  byte bVar4;
  basic_format_specs<char> *pbVar5;
  undefined1 auVar6 [16];
  unsigned___int128 uVar7;
  char cVar8;
  uint uVar9;
  buffer_appender<char> bVar10;
  _Alloc_hider _Var11;
  char *pcVar12;
  int iVar13;
  size_type sVar14;
  ulong uVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  buffer<char> *buf;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  string local_2a0;
  undefined8 local_280;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  grouping_impl<char>(&local_2a0,(locale_ref)(this->locale).locale_);
  if (local_2a0._M_string_length == 0) {
    on_dec(this);
    goto LAB_00132661;
  }
  cVar8 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
  if (cVar8 == '\0') {
    on_dec(this);
    goto LAB_00132661;
  }
  puVar1 = &this->abs_value;
  uVar7 = *puVar1;
  uVar18 = *(ulong *)((long)&this->abs_value + 8);
  auVar6 = (undefined1  [16])*puVar1;
  auVar21 = (undefined1  [16])*puVar1;
  local_280 = 1;
  if (((ulong)uVar7 < 10) <= uVar18) {
    local_280 = 4;
    auVar20 = auVar21;
    do {
      uVar15 = auVar20._8_8_;
      uVar17 = auVar20._0_8_;
      iVar13 = (int)local_280;
      if (uVar15 == 0 && (ulong)(99 < uVar17) <= -uVar15) {
        local_280 = (ulong)(iVar13 - 2);
        goto LAB_001323b2;
      }
      if (uVar15 == 0 && (ulong)(999 < uVar17) <= -uVar15) {
        local_280 = (ulong)(iVar13 - 1);
        goto LAB_001323b2;
      }
      if (uVar15 < (uVar17 < 10000)) goto LAB_001323b2;
      auVar20 = __udivti3(uVar17,uVar15,10000,0);
      local_280 = (ulong)(iVar13 + 4);
    } while (uVar15 != 0 || -uVar15 < (ulong)(99999 < uVar17));
    local_280 = (ulong)(iVar13 + 1);
  }
LAB_001323b2:
  _Var11._M_p = local_2a0._M_dataplus._M_p;
  uVar15 = local_280;
  uVar17 = local_280;
  if (local_2a0._M_string_length == 0) {
LAB_001323f9:
    iVar13 = (int)uVar17;
    uVar9 = (uint)uVar15;
    if (_Var11._M_p == local_2a0._M_dataplus._M_p + local_2a0._M_string_length) goto LAB_00132404;
  }
  else {
    iVar13 = (int)local_280 + (int)local_2a0._M_string_length;
    sVar14 = local_2a0._M_string_length;
    do {
      cVar3 = *_Var11._M_p;
      uVar9 = (int)uVar15 - (int)cVar3;
      if ((uVar9 == 0 || (int)uVar15 < (int)cVar3) || ((byte)(cVar3 + 0x81U) < 0x82))
      goto LAB_001323f9;
      uVar17 = (ulong)((int)uVar17 + 1);
      _Var11._M_p = _Var11._M_p + 1;
      uVar15 = (ulong)uVar9;
      sVar14 = sVar14 - 1;
    } while (sVar14 != 0);
LAB_00132404:
    iVar13 = (int)(uVar9 - 1) / (int)(local_2a0._M_dataplus._M_p + local_2a0._M_string_length)[-1] +
             iVar13;
  }
  pcVar12 = local_278 + (int)local_280;
  pcVar16 = pcVar12;
  if (((ulong)uVar7 < 100) <= uVar18) {
    do {
      lVar19 = auVar21._8_8_;
      uVar18 = auVar21._0_8_;
      pcVar12 = pcVar16 + -2;
      auVar21 = __udivti3(uVar18,lVar19,100,0);
      *(undefined2 *)(pcVar16 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (uVar18 + auVar21._0_8_ * -100) * 2);
      pcVar16 = pcVar12;
      auVar6 = auVar21;
    } while (lVar19 != 0 || (ulong)-lVar19 < (ulong)(9999 < uVar18));
  }
  if (auVar6._8_8_ == 0 && (ulong)(9 < auVar6._0_8_) <= (ulong)-auVar6._8_8_) {
    pcVar12[-1] = auVar6[0] | 0x30;
  }
  else {
    *(undefined2 *)(pcVar12 + -2) = *(undefined2 *)(basic_data<void>::digits + auVar6._0_8_ * 2);
  }
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0014ace0;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.capacity_ = 500;
  uVar9 = iVar13 + this->prefix_size;
  uVar18 = (ulong)uVar9;
  if (500 < uVar9) {
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar18);
  }
  pcVar12 = local_248.super_buffer<char>.ptr_;
  local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
  if (uVar18 <= local_248.super_buffer<char>.capacity_) {
    local_248.super_buffer<char>.size_ = uVar18;
  }
  pcVar16 = local_248.super_buffer<char>.ptr_ + (long)(int)uVar9 + -1;
  if (1 < (int)local_280) {
    uVar15 = (local_280 & 0xffffffff) + 1;
    iVar13 = 0;
    _Var11._M_p = local_2a0._M_dataplus._M_p;
    do {
      pcVar2 = pcVar16 + -1;
      *pcVar16 = local_278[uVar15 - 2];
      cVar3 = *_Var11._M_p;
      if ('\0' < cVar3) {
        iVar13 = iVar13 + 1;
        if ((cVar3 != '\x7f') && (iVar13 % (int)cVar3 == 0)) {
          if (_Var11._M_p + 1 != local_2a0._M_dataplus._M_p + local_2a0._M_string_length) {
            iVar13 = 0;
            _Var11._M_p = _Var11._M_p + 1;
          }
          pcVar16[-1] = cVar8;
          pcVar2 = pcVar16 + -2;
        }
      }
      pcVar16 = pcVar2;
      uVar15 = uVar15 - 1;
    } while (2 < uVar15);
  }
  *pcVar16 = local_278[0];
  if (this->prefix_size != 0) {
    pcVar16[-1] = '-';
  }
  pbVar5 = this->specs;
  uVar15 = 0;
  if (uVar18 <= (uint)pbVar5->width) {
    uVar15 = (uint)pbVar5->width - uVar18;
  }
  bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
       (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  bVar4 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                   (ulong)((byte)pbVar5->field_0x9 & 0xf));
  if (*(ulong *)((long)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x18) <
      *(long *)((long)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
               0x10) + uVar18 + (pbVar5->fill).size_ * uVar15) {
    (*(code *)**(undefined8 **)
                bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
              (bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
  }
  uVar18 = uVar15 >> (bVar4 & 0x3f);
  bVar10 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar10,uVar18,&pbVar5->fill);
  bVar10 = std::__copy_move<false,false,std::random_access_iterator_tag>::
           __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                     (pcVar12,pcVar12 + (int)uVar9,bVar10);
  bVar10 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar10,uVar15 - uVar18,&pbVar5->fill);
  (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
    operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_);
  }
LAB_00132661:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }